

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O1

REF_STATUS ref_cell_tattle(REF_CELL ref_cell,REF_INT cell)

{
  int iVar1;
  long lVar2;
  
  printf("cell %d %d:",(ulong)ref_cell->type,cell);
  iVar1 = ref_cell->size_per;
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      printf(" %d",(ulong)(uint)ref_cell->c2n[iVar1 * cell + lVar2]);
      iVar1 = ref_cell->size_per;
      lVar2 = lVar2 + 1;
    } while ((int)lVar2 < iVar1);
  }
  putchar(10);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cell_tattle(REF_CELL ref_cell, REF_INT cell) {
  REF_INT node;
  printf("cell %d %d:", (int)ref_cell_type(ref_cell), cell);
  for (node = 0; node < ref_cell_size_per(ref_cell); node++) {
    printf(" %d", ref_cell_c2n(ref_cell, node, cell));
  }
  printf("\n");
  return REF_SUCCESS;
}